

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextFragmentData>::position
          (QFragmentMapData<QTextFragmentData> *this,uint node,uint field)

{
  uint index;
  uint in_EDX;
  uint in_ESI;
  QFragmentMapData<QTextFragmentData> *in_RDI;
  bool bVar1;
  uint p;
  uint offset;
  QTextFragmentData *f;
  uint local_1c;
  QTextFragmentData *local_18;
  uint local_c;
  
  local_18 = fragment(in_RDI,in_ESI);
  local_1c = (local_18->super_QFragment<1>).size_left_array[in_EDX];
  local_c = in_ESI;
  while ((local_18->super_QFragment<1>).parent != 0) {
    index = (local_18->super_QFragment<1>).parent;
    local_18 = fragment(in_RDI,index);
    bVar1 = (local_18->super_QFragment<1>).right == local_c;
    local_c = index;
    if (bVar1) {
      local_1c = (local_18->super_QFragment<1>).size_left_array[in_EDX] +
                 (local_18->super_QFragment<1>).size_array[in_EDX] + local_1c;
    }
  }
  return local_1c;
}

Assistant:

inline uint position(uint node, uint field = 0) const {
        Q_ASSERT(field < Fragment::size_array_max);
        const Fragment *f = fragment(node);
        uint offset = f->size_left_array[field];
        while (f->parent) {
            uint p = f->parent;
            f = fragment(p);
            if (f->right == node)
                offset += f->size_left_array[field] + f->size_array[field];
            node = p;
        }
        return offset;
    }